

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O2

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ContinueStdSOC(Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,double cX,int vX,double cY,ConeArgs *rhs_args)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer piVar3;
  int *piVar4;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  long lVar5;
  int *piVar6;
  double dVar7;
  NodeRange NVar8;
  allocator_type local_119;
  vector<double,_std::allocator<double>_> c;
  vector<int,_std::allocator<int>_> x;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  local_70;
  
  dVar7 = rhs_args->const_term;
  lVar5 = (ulong)(dVar7 != 0.0) + 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&x,((long)(rhs_args->coefs_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_args->coefs_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) + lVar5,(allocator_type *)&c);
  std::vector<double,_std::allocator<double>_>::vector
            (&c,((long)(rhs_args->coefs_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_args->coefs_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) + lVar5,&local_119);
  *x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = vX;
  *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       ABS(cX);
  pdVar1 = (rhs_args->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (rhs_args->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (rhs_args->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; (long)pdVar2 - (long)pdVar1 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar5 + 1] = piVar3[lVar5];
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar5 + 1] = pdVar1[lVar5] * ABS(cY);
  }
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    NVar8 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(&((this->
                             super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                             ).mc_)->
                            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ,1.0);
    x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[-1] =
         NVar8.ir_.beg_;
    dVar7 = rhs_args->const_term;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
    [-1] = ABS(cY) * dVar7;
  }
  piVar4 = (rhs_args->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (rhs_args->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start; piVar6 != piVar4; piVar6 = piVar6 + 1) {
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::DecrementVarUsage(&((this->
                          super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ).mc_)->
                         super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        ,*piVar6);
  }
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mc_;
  local_88._M_impl.super__Vector_impl_data._M_start =
       x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start =
       c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_a8._M_impl.super__Vector_impl_data._M_finish =
       c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage =
       c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ::CustomStaticConstraint(&local_70,(Arguments *)&local_88,(Parameters *)&local_a8);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  AddConstraint<mp::CustomStaticConstraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::QuadraticConeId>>
            (this_00,&local_70);
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ::~CustomStaticConstraint(&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&x.super__Vector_base<int,_std::allocator<int>_>);
  return true;
}

Assistant:

bool ContinueStdSOC(
      double cX, int vX, double cY,
      const ConeArgs& rhs_args) {
    const size_t constNZ = (0.0 != std::fabs(rhs_args.const_term));
    std::vector<int> x(rhs_args.size()+1+constNZ);
    std::vector<double> c(rhs_args.size()+1+constNZ);
    x[0] = vX;
    c[0] = std::fabs(cX);
    auto coefY_abs = std::fabs(cY);
    for (size_t iPush=0; iPush<rhs_args.size(); ++iPush) {
      x[iPush+1] = rhs_args.vars_[iPush];
      c[iPush+1] = coefY_abs * rhs_args.coefs_[iPush];
    }
    if (constNZ) {
      assert(0.0 < rhs_args.const_term);
      x.back() = int( MC().MakeFixedVar(1.0) );
      c.back() = coefY_abs * std::sqrt(rhs_args.const_term);
    }
    for (auto r: rhs_args.res_vars_to_delete_)
      MC().DecrementVarUsage(r);
    MC().AddConstraint(
          QuadraticConeConstraint(
            std::move(x), std::move(c)));
    return true;
  }